

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional8::initObjects
          (PipelineStatisticsQueryTestFunctional8 *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  uint atomic_counter_value;
  uint drawcall_args [3];
  long lVar3;
  
  iVar1 = (*((this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  PipelineStatisticsQueryTestFunctionalBase::buildProgram
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,
             PipelineStatisticsQueryUtilities::dummy_cs_code,(char *)0x0,(char *)0x0,(char *)0x0,
             (char *)0x0,(char *)0x0);
  (**(code **)(lVar3 + 0x1680))((this->super_PipelineStatisticsQueryTestFunctionalBase).m_po_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x10da);
  atomic_counter_value = 0;
  drawcall_args._0_8_ = &DAT_100000001;
  drawcall_args[2] = 1;
  (**(code **)(lVar3 + 0x6c8))(1,&this->m_bo_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x10e8);
  (**(code **)(lVar3 + 0x40))(0x8892,this->m_bo_id);
  (**(code **)(lVar3 + 0x40))(0x90ee,this->m_bo_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x10ec);
  (**(code **)(lVar3 + 0x48))(0x92c0,0,this->m_bo_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x10f0);
  (**(code **)(lVar3 + 0x150))(0x8892,0x10,0,0x88e4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x10f3);
  (**(code **)(lVar3 + 0x168))(0x8892,0,4,&atomic_counter_value);
  (**(code **)(lVar3 + 0x168))(0x8892,4,0xc,drawcall_args);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBufferSubData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0x10f9);
  this->m_bo_dispatch_compute_indirect_args_offset = 4;
  return;
}

Assistant:

void PipelineStatisticsQueryTestFunctional8::initObjects()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	buildProgram(PipelineStatisticsQueryUtilities::dummy_cs_code, DE_NULL, /* fs_body */
				 DE_NULL,												   /* gs_body */
				 DE_NULL,												   /* tc_body */
				 DE_NULL,												   /* te_body */
				 DE_NULL);												   /* vs_body */

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Init BO to hold atomic counter data, as well as the indirect dispatch compute
	 * draw call arguments */
	unsigned int	   atomic_counter_value = 0;
	const unsigned int bo_size				= sizeof(unsigned int) * (1 /* counter value */ + 3 /* draw call args */);

	const unsigned int drawcall_args[] = {
		1, /* num_groups_x */
		1, /* num_groups_y */
		1  /* num_groups_z */
	};

	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_id);
	gl.bindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call(s) failed.");

	gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, /* index */
					  m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, bo_size, DE_NULL, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	gl.bufferSubData(GL_ARRAY_BUFFER, 0, /* offset */
					 sizeof(unsigned int), &atomic_counter_value);
	gl.bufferSubData(GL_ARRAY_BUFFER, sizeof(unsigned int), /* offset */
					 sizeof(drawcall_args), drawcall_args);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

	/* Store rthe offset, at which the draw call args start */
	m_bo_dispatch_compute_indirect_args_offset = sizeof(unsigned int);
}